

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O0

void StdStringStreamWithRewind<unsigned_short>(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  char *pcVar3;
  rep rVar4;
  fpos<__mbstate_t> local_200;
  ushort local_1ea;
  undefined1 local_1e8 [6];
  unsigned_short i;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  unsigned_short _imax;
  unsigned_short _imin;
  ResultType _result;
  allocator local_1b1;
  string local_1b0 [32];
  stringstream local_190 [8];
  stringstream ss;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,0x40,'0',&local_1b1);
  std::__cxx11::stringstream::str((string *)local_190);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  poVar2 = std::operator<<((ostream *)&std::cout,"[");
  pcVar3 = std::type_info::name((type_info *)&unsigned_short::typeinfo);
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,"] ");
  poVar2 = std::operator<<(poVar2,"std::stringstream with rewind");
  poVar2 = std::operator<<(poVar2,"... ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  _prof.mStart.__d.__r._6_2_ = 0;
  _prof.mStart.__d.__r._4_2_ = 0xffff;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_1e8,
             (duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffe30);
  for (local_1ea = 0; local_1ea != 0xffff; local_1ea = local_1ea + 1) {
    std::fpos<__mbstate_t>::fpos(&local_200,0);
    std::ostream::seekp(local_180,local_200._M_off,local_200._M_state);
    std::ostream::operator<<(local_180,local_1ea);
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)local_1e8);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::fixed);
  _Var1 = std::setprecision(3);
  poVar2 = std::operator<<(poVar2,_Var1);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffe30);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_190);
  return;
}

Assistant:

void StdStringStreamWithRewind()
{
    std::stringstream ss;
    ss.str(std::string(64, '0'));
    PROFILING_BEGIN(T, "std::stringstream with rewind")
    ss.seekp(0);
    ss << i;
    PROFILING_END()
}